

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O2

bool obx::anon_unknown_3::CollectingVisitorUniquePtr<objectbox::tsdemo::SensorValues>::visit
               (void *data,size_t size,void *userData)

{
  SensorValues *local_20;
  
  if (userData != (void *)0x0) {
    local_20 = (SensorValues *)operator_new(0x48);
    local_20->id = 0;
    local_20->time = 0;
    local_20->temperatureOutside = 0.0;
    local_20->temperatureInside = 0.0;
    local_20->loadCpu4 = 0.0;
    local_20->temperatureCpu = 0.0;
    local_20->loadCpu1 = 0.0;
    local_20->loadCpu2 = 0.0;
    local_20->loadCpu3 = 0.0;
    std::
    vector<std::unique_ptr<objectbox::tsdemo::SensorValues,std::default_delete<objectbox::tsdemo::SensorValues>>,std::allocator<std::unique_ptr<objectbox::tsdemo::SensorValues,std::default_delete<objectbox::tsdemo::SensorValues>>>>
    ::emplace_back<objectbox::tsdemo::SensorValues*>
              ((vector<std::unique_ptr<objectbox::tsdemo::SensorValues,std::default_delete<objectbox::tsdemo::SensorValues>>,std::allocator<std::unique_ptr<objectbox::tsdemo::SensorValues,std::default_delete<objectbox::tsdemo::SensorValues>>>>
                *)userData,&local_20);
    objectbox::tsdemo::SensorValues::_OBX_MetaInfo::fromFlatBuffer
              (data,size,*(SensorValues **)(*(long *)((long)userData + 8) + -8));
    return true;
  }
  __assert_fail("self",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/objectbox[P]objectbox-ts-demo/build_O2/_deps/objectbox-download-src/include/objectbox.hpp"
                ,0x449,
                "static bool obx::(anonymous namespace)::CollectingVisitorUniquePtr<objectbox::tsdemo::SensorValues>::visit(const void *, size_t, void *) [EntityT = objectbox::tsdemo::SensorValues]"
               );
}

Assistant:

static bool visit(const void* data, size_t size, void* userData) {
        CollectingVisitorUniquePtr<EntityT>* self = static_cast<CollectingVisitorUniquePtr<EntityT>*>(userData);
        assert(self);
        self->items.emplace_back(new EntityT());
        std::unique_ptr<EntityT>& ptrRef = self->items.back();
        EntityT::_OBX_MetaInfo::fromFlatBuffer(data, size, *ptrRef);
        return true;
    }